

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void dumpU32(uint32_t value,bool inArray)

{
  int i;
  int iVar1;
  
  for (iVar1 = 0x18; -1 < iVar1; iVar1 = iVar1 + -8) {
    printf("%02hhx ",(ulong)(value >> ((byte)iVar1 & 0x1f) & 0xff));
  }
  printf("            ");
  if (inArray) {
    putchar(0x20);
    return;
  }
  return;
}

Assistant:

void dumpU32(uint32_t value, bool inArray = false)
{
	for (int i = 24; i >= 0; i -= 8)
	{
		uint8_t v;
		v = (value >> i) & 0xff;
		printf("%02hhx ", v);
	}
	printf("            ");
	if (inArray)
	{
		printf(" ");
	}
}